

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O3

void P_LoadSegs<mapseg_t>(MapData *map)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  FileReader *pFVar4;
  double *pdVar5;
  double *pdVar6;
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  vertex_t *pvVar12;
  vertex_t *pvVar13;
  seg_t *psVar14;
  int iVar15;
  void *__s;
  size_t __n;
  void *pvVar16;
  long lVar17;
  undefined4 *puVar18;
  long lVar19;
  vertex_t **ppvVar20;
  uint uVar21;
  line_t_conflict *plVar22;
  ulong uVar23;
  ulong uVar24;
  double dVar25;
  
  uVar24 = (ulong)numvertexes;
  __s = operator_new__(uVar24);
  pFVar4 = map->MapLumps[5].Reader;
  if (pFVar4 == (FileReader *)0x0) {
    memset(__s,0,uVar24);
    numsegs = 0;
  }
  else {
    uVar23 = (ulong)(int)pFVar4->Length;
    memset(__s,0,uVar24);
    numsegs = (int)(uVar23 / 0xc);
    if (numsegs != 0) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = (long)numsegs;
      __n = SUB168(auVar7 * ZEXT816(0x30),0);
      uVar24 = 0xffffffffffffffff;
      if (SUB168(auVar7 * ZEXT816(0x30),8) == 0) {
        uVar24 = __n;
      }
      segs = (seg_t *)operator_new__(uVar24);
      memset(segs,0,__n);
      pvVar16 = operator_new__(uVar23);
      map->file = pFVar4;
      (*(pFVar4->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar4,0,0);
      (*(map->file->super_FileReaderBase)._vptr_FileReaderBase[2])(map->file,pvVar16,uVar23);
      lVar17 = (long)numsubsectors;
      if (0 < lVar17) {
        lVar19 = 0;
        do {
          *(seg_t **)((long)&subsectors->firstline + lVar19) =
               segs + *(long *)((long)&subsectors->firstline + lVar19);
          lVar19 = lVar19 + 0x30;
        } while (lVar17 * 0x30 != lVar19);
      }
      pvVar12 = vertexes;
      if (0 < numlines) {
        ppvVar20 = &lines->v2;
        iVar15 = numlines;
        do {
          *(undefined1 *)((long)__s + ((long)*ppvVar20 - (long)pvVar12 >> 4)) = 1;
          *(undefined1 *)
           ((long)__s + ((long)((line_t_conflict *)(ppvVar20 + -1))->v1 - (long)pvVar12 >> 4)) = 1;
          ppvVar20 = ppvVar20 + 0x13;
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
      if (0 < numsegs) {
        lVar17 = 0;
        lVar19 = 0;
        do {
          psVar14 = segs;
          pvVar12 = vertexes;
          uVar1 = *(ushort *)((long)pvVar16 + lVar17);
          uVar2 = *(ushort *)((long)pvVar16 + lVar17 + 2);
          uVar24 = (ulong)uVar2;
          if ((numvertexes <= (int)(uint)uVar1) || (numvertexes <= (int)(uint)uVar2)) {
            puVar18 = (undefined4 *)__cxa_allocate_exception(0xc);
            uVar21 = (uint)uVar2;
            if ((uint)uVar2 < (uint)uVar1) {
              uVar21 = (uint)uVar1;
            }
            *puVar18 = 0;
            puVar18[1] = (int)lVar19;
            puVar18[2] = uVar21;
            __cxa_throw(puVar18,&badseg::typeinfo,0);
          }
          *(vertex_t **)((long)&segs->v1 + lVar17 * 4) = vertexes + uVar1;
          pvVar13 = vertexes;
          *(vertex_t **)((long)&psVar14->v2 + lVar17 * 4) = vertexes + uVar2;
          uVar3 = *(ushort *)((long)pvVar16 + lVar17 + 4);
          dVar8 = c_atan2(pvVar13[uVar2].p.Y - pvVar12[uVar1].p.Y,
                          pvVar13[uVar2].p.X - pvVar12[uVar1].p.X);
          dVar10 = (double)((ulong)uVar3 << 0x10) * 8.381903171539307e-08;
          if (1.0 <= ABS((double)SUB84((dVar8 * 57.29577951308232 - dVar10) * 11930464.711111112 +
                                       6755399441055744.0,0) * 8.381903171539307e-08)) {
            pdVar5 = *(double **)((long)&psVar14->v1 + lVar17 * 4);
            pdVar6 = *(double **)((long)&psVar14->v2 + lVar17 * 4);
            dVar25 = *pdVar6 - *pdVar5;
            dVar8 = pdVar6[1] - pdVar5[1];
            dVar8 = c_sqrt(dVar8 * dVar8 + dVar25 * dVar25);
            dVar10 = FFastTrig::cos(&fasttrig,dVar10 * 11930464.711111112 + 6755399441055744.0);
            dVar25 = FFastTrig::sin(&fasttrig,dVar10);
            if ((uVar1 < uVar2) && (*(char *)((long)__s + uVar24) == '\0')) {
              pdVar5 = *(double **)((long)&psVar14->v1 + lVar17 * 4);
              dVar25 = dVar25 * dVar8 + pdVar5[1];
              auVar9._8_4_ = SUB84(dVar25,0);
              auVar9._0_8_ = dVar10 * dVar8 + *pdVar5;
              auVar9._12_4_ = (int)((ulong)dVar25 >> 0x20);
              **(undefined1 (**) [16])((long)&psVar14->v2 + lVar17 * 4) = auVar9;
            }
            else {
              if (*(char *)((long)__s + (ulong)uVar1) != '\0') goto LAB_0044d7d2;
              pdVar5 = *(double **)((long)&psVar14->v1 + lVar17 * 4);
              pdVar6 = *(double **)((long)&psVar14->v2 + lVar17 * 4);
              dVar11 = pdVar6[1];
              *pdVar5 = *pdVar6 - dVar10 * dVar8;
              pdVar5[1] = dVar11 - dVar25 * dVar8;
              uVar24 = (ulong)uVar1;
            }
            *(undefined1 *)((long)__s + uVar24) = 1;
          }
LAB_0044d7d2:
          uVar1 = *(ushort *)((long)pvVar16 + lVar17 + 6);
          uVar21 = (uint)uVar1;
          if ((uint)numlines <= (uint)uVar1) {
            puVar18 = (undefined4 *)__cxa_allocate_exception(0xc);
            *puVar18 = 1;
LAB_0044d937:
            puVar18[1] = (int)lVar19;
            puVar18[2] = uVar21;
            __cxa_throw(puVar18,&badseg::typeinfo,0);
          }
          plVar22 = lines + uVar1;
          *(line_t_conflict **)((long)&psVar14->linedef + lVar17 * 4) = plVar22;
          uVar24 = (ulong)*(short *)((long)pvVar16 + lVar17 + 8);
          if ((uint)numsides <=
              (uint)((int)((ulong)((long)plVar22->sidedef[uVar24] - (long)sides) >> 6) * -0x55555555
                    )) {
            puVar18 = (undefined4 *)__cxa_allocate_exception(0xc);
            uVar21 = (int)((ulong)((long)plVar22->sidedef[uVar24] - (long)sides) >> 6) * -0x55555555
            ;
            *puVar18 = 2;
            goto LAB_0044d937;
          }
          *(side_t **)((long)&psVar14->sidedef + lVar17 * 4) = plVar22->sidedef[uVar24];
          *(sector_t_conflict **)((long)&psVar14->frontsector + lVar17 * 4) =
               plVar22->sidedef[uVar24]->sector;
          uVar21 = plVar22->flags;
          if (((uVar21 & 4) == 0) || (plVar22->sidedef[uVar24 ^ 1] == (side_t *)0x0)) {
            *(undefined8 *)((long)&psVar14->backsector + lVar17 * 4) = 0;
            plVar22->flags = uVar21 & 0xfffffffb;
          }
          else {
            *(sector_t_conflict **)((long)&psVar14->backsector + lVar17 * 4) =
                 plVar22->sidedef[uVar24 ^ 1]->sector;
          }
          lVar19 = lVar19 + 1;
          lVar17 = lVar17 + 0xc;
        } while (lVar19 < numsegs);
      }
      operator_delete__(__s);
      operator_delete__(pvVar16);
      return;
    }
  }
  Printf("This map has no segs.\n");
  if (subsectors != (subsector_t *)0x0) {
    operator_delete__(subsectors);
  }
  if (nodes != (node_t *)0x0) {
    operator_delete__(nodes);
  }
  operator_delete__(__s);
  ForceNodeBuild = true;
  return;
}

Assistant:

void P_LoadSegs (MapData * map)
{
	int  i;
	BYTE *data;
	BYTE *vertchanged = new BYTE[numvertexes];	// phares 10/4/98
	DWORD segangle;
	line_t* line;		// phares 10/4/98
	//int ptp_angle;		// phares 10/4/98
	//int delta_angle;	// phares 10/4/98
	int vnum1,vnum2;	// phares 10/4/98
	int lumplen = map->Size(ML_SEGS);

	memset (vertchanged,0,numvertexes); // phares 10/4/98

	numsegs = lumplen / sizeof(segtype);

	if (numsegs == 0)
	{
		Printf ("This map has no segs.\n");
		delete[] subsectors;
		delete[] nodes;
		delete[] vertchanged;
		ForceNodeBuild = true;
		return;
	}

	segs = new seg_t[numsegs];
	memset (segs, 0, numsegs*sizeof(seg_t));

	data = new BYTE[lumplen];
	map->Read(ML_SEGS, data);

	for (i = 0; i < numsubsectors; ++i)
	{
		subsectors[i].firstline = &segs[(size_t)subsectors[i].firstline];
	}

	// phares: 10/4/98: Vertchanged is an array that represents the vertices.
	// Mark those used by linedefs. A marked vertex is one that is not a
	// candidate for movement further down.

	line = lines;
	for (i = 0; i < numlines ; i++, line++)
	{
		vertchanged[line->v1 - vertexes] = vertchanged[line->v2 - vertexes] = 1;
	}

	try
	{
		for (i = 0; i < numsegs; i++)
		{
			seg_t *li = segs + i;
			segtype *ml = ((segtype *) data) + i;

			int side, linedef;
			line_t *ldef;

			vnum1 = ml->V1();
			vnum2 = ml->V2();

			if (vnum1 >= numvertexes || vnum2 >= numvertexes)
			{
				throw badseg(0, i, MAX(vnum1, vnum2));
			}

			li->v1 = &vertexes[vnum1];
			li->v2 = &vertexes[vnum2];

			segangle = (WORD)LittleShort(ml->angle);

			// phares 10/4/98: In the case of a lineseg that was created by splitting
			// another line, it appears that the line angle is inherited from the
			// father line. Due to roundoff, the new vertex may have been placed 'off
			// the line'. When you get close to such a line, and it is very short,
			// it's possible that the roundoff error causes 'firelines', the thin
			// lines that can draw from screen top to screen bottom occasionally. This
			// is due to all the angle calculations that are done based on the line
			// angle, the angles from the viewer to the vertices, and the viewer's
			// angle in the world. In the case of firelines, the rounded-off position
			// of one of the vertices determines one of these angles, and introduces
			// an error in the scaling factor for mapping textures and determining
			// where on the screen the ceiling and floor spans should be shown. For a
			// fireline, the engine thinks the ceiling bottom and floor top are at the
			// midpoint of the screen. So you get ceilings drawn all the way down to the
			// screen midpoint, and floors drawn all the way up. Thus 'firelines'. The
			// name comes from the original sighting, which involved a fire texture.
			//
			// To correct this, reset the vertex that was added so that it sits ON the
			// split line.
			//
			// To know which of the two vertices was added, its number is greater than
			// that of the last of the author-created vertices. If both vertices of the
			// line were added by splitting, pick the higher-numbered one. Once you've
			// changed a vertex, don't change it again if it shows up in another seg.
			//
			// To determine if there's an error in the first place, find the
			// angle of the line between the two seg vertices. If it's one degree or more
			// off, then move one vertex. This may seem insignificant, but one degree
			// errors _can_ cause firelines.

			DAngle ptp_angle = (li->v2->fPos() - li->v1->fPos()).Angle();
			DAngle seg_angle = AngleToFloat(segangle << 16);
			DAngle delta_angle = absangle(ptp_angle, seg_angle);

			if (delta_angle >= 1.)
			{
				double dis = (li->v2->fPos() - li->v1->fPos()).Length();
				DVector2 delta = seg_angle.ToVector(dis);
				if ((vnum2 > vnum1) && (vertchanged[vnum2] == 0))
				{
					li->v2->set(li->v1->fPos() + delta);
					vertchanged[vnum2] = 1; // this was changed
				}
				else if (vertchanged[vnum1] == 0)
				{
					li->v1->set(li->v2->fPos() - delta);
					vertchanged[vnum1] = 1; // this was changed
				}
			}

			linedef = LittleShort(ml->linedef);
			if ((unsigned)linedef >= (unsigned)numlines)
			{
				throw badseg(1, i, linedef);
			}
			ldef = &lines[linedef];
			li->linedef = ldef;
			side = LittleShort(ml->side);
			if ((unsigned)(ldef->sidedef[side] - sides) >= (unsigned)numsides)
			{
				throw badseg(2, i, int(ldef->sidedef[side] - sides));
			}
			li->sidedef = ldef->sidedef[side];
			li->frontsector = ldef->sidedef[side]->sector;

			// killough 5/3/98: ignore 2s flag if second sidedef missing:
			if (ldef->flags & ML_TWOSIDED && ldef->sidedef[side^1] != NULL)
			{
				li->backsector = ldef->sidedef[side^1]->sector;
			}
			else
			{
				li->backsector = 0;
				ldef->flags &= ~ML_TWOSIDED;
			}
		}
	}
	catch (const badseg &bad) // the preferred way is to catch by (const) reference.
	{
		switch (bad.badtype)
		{
		case 0:
			Printf ("Seg %d references a nonexistant vertex %d (max %d).\n", bad.badsegnum, bad.baddata, numvertexes);
			break;

		case 1:
			Printf ("Seg %d references a nonexistant linedef %d (max %d).\n", bad.badsegnum, bad.baddata, numlines);
			break;

		case 2:
			Printf ("The linedef for seg %d references a nonexistant sidedef %d (max %d).\n", bad.badsegnum, bad.baddata, numsides);
			break;
		}
		Printf ("The BSP will be rebuilt.\n");
		delete[] segs;
		delete[] subsectors;
		delete[] nodes;
		ForceNodeBuild = true;
	}

	delete[] vertchanged; // phares 10/4/98
	delete[] data;
}